

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FxchDiv.c
# Opt level: O3

int Fxch_DivCreate(Fxch_Man_t *pFxchMan,Fxch_SubCube_t *pSubCube0,Fxch_SubCube_t *pSubCube1)

{
  uint32_t uVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *pVVar4;
  int *piVar5;
  int *piVar6;
  uint *puVar7;
  uint uVar8;
  Vec_Int_t *pVVar9;
  uint uVar10;
  uint uVar12;
  long lVar13;
  long lVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar11;
  
  pVVar9 = pFxchMan->vCubeFree;
  pVVar9->nSize = 0;
  lVar14 = (long)(int)pSubCube0->iCube;
  if (lVar14 < 0) goto LAB_004be9b9;
  uVar10 = pFxchMan->vCubes->nSize;
  if ((int)uVar10 <= (int)pSubCube0->iCube) goto LAB_004be9b9;
  uVar8 = *(uint *)&pSubCube0->field_0x8;
  pVVar4 = pFxchMan->vCubes->pArray;
  uVar17 = pVVar4[lVar14].nSize;
  if ((int)uVar17 <= (int)(uVar8 & 0xffff)) goto LAB_004be9d8;
  lVar13 = (long)(int)pSubCube1->iCube;
  if ((lVar13 < 0) || (uVar10 <= pSubCube1->iCube)) goto LAB_004be9b9;
  uVar10 = *(uint *)&pSubCube1->field_0x8;
  uVar15 = pVVar4[lVar13].nSize;
  if ((int)uVar15 <= (int)(uVar10 & 0xffff)) goto LAB_004be9d8;
  piVar5 = pVVar4[lVar14].pArray;
  uVar18 = piVar5[uVar8 & 0xffff];
  piVar6 = pVVar4[lVar13].pArray;
  uVar16 = piVar6[uVar10 & 0xffff];
  if (uVar8 < 0x10000) {
    if (uVar10 < 0x10000) {
      Vec_IntPush(pVVar9,uVar18);
LAB_004be58a:
      pVVar9 = pFxchMan->vCubeFree;
      uVar18 = uVar16;
    }
    else {
      if (uVar15 <= uVar10 >> 0x10) goto LAB_004be9d8;
      uVar10 = piVar6[uVar10 >> 0x10];
      Vec_IntPush(pVVar9,uVar18);
      if ((int)uVar18 < 0) {
LAB_004bea35:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x131,"int Abc_LitNot(int)");
      }
      if (uVar16 != (uVar18 ^ 1)) {
        if (uVar10 != (uVar18 ^ 1)) goto LAB_004be619;
        goto LAB_004be58a;
      }
LAB_004be60b:
      uVar18 = uVar10;
      pVVar9 = pFxchMan->vCubeFree;
    }
LAB_004be614:
    Vec_IntPush(pVVar9,uVar18);
  }
  else {
    uVar8 = uVar8 >> 0x10;
    if (uVar10 < 0x10000) {
      if (uVar17 <= uVar8) goto LAB_004be9d8;
      uVar10 = piVar5[uVar8];
      Vec_IntPush(pVVar9,uVar16);
      if ((int)uVar16 < 0) goto LAB_004bea35;
      if (uVar18 == (uVar16 ^ 1)) goto LAB_004be60b;
      if (uVar10 == (uVar16 ^ 1)) {
        pVVar9 = pFxchMan->vCubeFree;
        goto LAB_004be614;
      }
    }
    else {
      if ((uVar17 <= uVar8) || (uVar15 <= uVar10 >> 0x10)) goto LAB_004be9d8;
      iVar2 = piVar5[uVar8];
      iVar3 = piVar6[uVar10 >> 0x10];
      if ((int)uVar18 < (int)uVar16) {
        if ((int)uVar18 < 0) goto LAB_004be9f7;
        Vec_IntPush(pVVar9,uVar18 * 2);
        Vec_IntPush(pFxchMan->vCubeFree,uVar16 * 2 + 1);
        if (iVar2 < 0) goto LAB_004be9f7;
        Vec_IntPush(pFxchMan->vCubeFree,iVar2 * 2);
      }
      else {
        if ((int)uVar16 < 0) goto LAB_004be9f7;
        Vec_IntPush(pVVar9,uVar16 * 2);
        Vec_IntPush(pFxchMan->vCubeFree,uVar18 * 2 + 1);
        if (iVar3 < 0) goto LAB_004be9f7;
        Vec_IntPush(pFxchMan->vCubeFree,iVar3 * 2);
        iVar3 = iVar2;
      }
      if (iVar3 < 0) goto LAB_004be9f7;
      Vec_IntPush(pFxchMan->vCubeFree,iVar3 * 2 + 1);
      if (pFxchMan->vCubeFree->nSize != 4) {
        __assert_fail("Vec_IntSize(vCubeFree) == 4",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fxch/FxchDiv.c"
                      ,0x1e,"int Fxch_DivNormalize(Vec_Int_t *)");
      }
      puVar7 = (uint *)pFxchMan->vCubeFree->pArray;
      uVar10 = *puVar7;
      if (((int)uVar10 < 0) || (uVar8 = puVar7[1], (int)uVar8 < 0)) {
LAB_004bea16:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x130,"int Abc_LitIsCompl(int)");
      }
      uVar15 = uVar10 & 1;
      uVar18 = uVar8 & 1;
      uVar17 = puVar7[2];
      if ((uVar8 ^ uVar10) < 4 && uVar15 != uVar18) {
        if (((int)uVar17 < 0) || (uVar16 = puVar7[3], (int)uVar16 < 0)) goto LAB_004bea16;
        uVar19 = uVar17 & 1;
        uVar21 = uVar16 & 1;
        if (uVar19 == uVar21) {
          return -1;
        }
        uVar12 = uVar10;
        uVar11 = uVar8;
        if (uVar15 == uVar19) {
          uVar20 = uVar16;
          uVar16 = uVar17;
          if (uVar18 != uVar21) {
            __assert_fail("Abc_LitIsCompl(L[1]) == Abc_LitIsCompl(L[3])",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fxch/FxchDiv.c"
                          ,0x26,"int Fxch_DivNormalize(Vec_Int_t *)");
          }
        }
        else {
          if (uVar15 != uVar21) {
            __assert_fail("Abc_LitIsCompl(L[0]) == Abc_LitIsCompl(L[3])",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fxch/FxchDiv.c"
                          ,0x2b,"int Fxch_DivNormalize(Vec_Int_t *)");
          }
          uVar20 = uVar17;
          if (uVar18 != uVar19) {
            __assert_fail("Abc_LitIsCompl(L[1]) == Abc_LitIsCompl(L[2])",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fxch/FxchDiv.c"
                          ,0x2c,"int Fxch_DivNormalize(Vec_Int_t *)");
          }
        }
      }
      else {
        if ((int)uVar17 < 0) goto LAB_004bea16;
        uVar19 = uVar17 & 1;
        uVar16 = puVar7[3];
        uVar20 = uVar10;
        if ((uVar17 ^ uVar8) < 4 && uVar18 != uVar19) {
          if ((int)uVar16 < 0) goto LAB_004bea16;
          if (uVar15 == (uVar16 & 1)) {
            return -1;
          }
          uVar12 = uVar8;
          uVar11 = uVar17;
          if (uVar15 == uVar18) {
            uVar20 = uVar16;
            uVar16 = uVar10;
          }
        }
        else {
          if ((int)uVar16 < 0) goto LAB_004bea16;
          if (uVar15 == uVar18) {
            return -1;
          }
          if (uVar19 == (uVar16 & 1)) {
            return -1;
          }
          if (3 < (uVar16 ^ uVar17)) {
            return -1;
          }
          uVar12 = uVar17;
          uVar11 = uVar16;
          uVar16 = uVar8;
          if (uVar19 == uVar15) {
            uVar20 = uVar8;
            uVar16 = uVar10;
          }
        }
      }
      uVar10 = uVar11 >> 1;
      if ((uVar11 ^ uVar12) >> 1 != 1) {
        __assert_fail("LitA0 == Abc_LitNot(LitB0)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fxch/FxchDiv.c"
                      ,0x46,"int Fxch_DivNormalize(Vec_Int_t *)");
      }
      uVar20 = uVar20 >> 1;
      uVar8 = uVar12 >> 1;
      uVar17 = uVar16 >> 1;
      if ((uVar12 & 2) == 0) {
        uVar8 = uVar10;
        uVar17 = uVar20;
        uVar10 = uVar12 >> 1;
        uVar20 = uVar16 >> 1;
      }
      if ((uVar10 & 1) != 0) {
        __assert_fail("!Abc_LitIsCompl(LitA0)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fxch/FxchDiv.c"
                      ,0x4c,"int Fxch_DivNormalize(Vec_Int_t *)");
      }
      *puVar7 = uVar10 * 2;
      puVar7[1] = uVar8 * 2 + 1;
      puVar7[2] = uVar20 * 2 & 0xfffffffc;
      puVar7[3] = (uVar17 ^ uVar20 & 1) * 2 + 1;
    }
  }
LAB_004be619:
  pVVar9 = pFxchMan->vCubeFree;
  if (pVVar9->nSize == 0) {
    return -1;
  }
  if (pVVar9->nSize == 2) {
    qsort(pVVar9->pArray,2,4,Vec_IntSortCompare1);
    pVVar9 = pFxchMan->vCubeFree;
    if (pVVar9->nSize < 1) {
LAB_004be9d8:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    piVar5 = pVVar9->pArray;
    if (*piVar5 < 0) {
LAB_004be9f7:
      __assert_fail("Var >= 0 && !(c >> 1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                    ,0x12e,"int Abc_Var2Lit(int, int)");
    }
    *piVar5 = *piVar5 * 2;
    if (pVVar9->nSize < 2) goto LAB_004be9d8;
    if (piVar5[1] < 0) goto LAB_004be9f7;
    piVar5[1] = piVar5[1] * 2 + 1;
  }
  uVar1 = pSubCube0->iCube;
  if (-1 < (long)(int)uVar1) {
    uVar10 = pFxchMan->vCubes->nSize;
    if ((int)uVar1 < (int)uVar10) {
      uVar8 = pSubCube1->iCube;
      if ((-1 < (long)(int)uVar8) && (uVar8 < uVar10)) {
        if ((pVVar9->nSize & 1U) != 0) {
          return -1;
        }
        pVVar4 = pFxchMan->vCubes->pArray;
        iVar2 = pVVar4[(int)uVar1].nSize;
        iVar3 = pVVar4[(int)uVar8].nSize;
        if (iVar2 < iVar3) {
          iVar3 = iVar2;
        }
        return ~(pVVar9->nSize >> 1) + iVar3;
      }
    }
  }
LAB_004be9b9:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
}

Assistant:

int Fxch_DivCreate( Fxch_Man_t* pFxchMan,
                    Fxch_SubCube_t* pSubCube0,
                    Fxch_SubCube_t* pSubCube1 )
{
    int Base = 0;

    int SC0_Lit0,
        SC0_Lit1,
        SC1_Lit0,
        SC1_Lit1;

    int Cube0Size,
        Cube1Size;

    Vec_IntClear( pFxchMan->vCubeFree );

    SC0_Lit0 = Fxch_ManGetLit( pFxchMan, pSubCube0->iCube, pSubCube0->iLit0 );
    SC0_Lit1 = 0;
    SC1_Lit0 = Fxch_ManGetLit( pFxchMan, pSubCube1->iCube, pSubCube1->iLit0 );
    SC1_Lit1 = 0;

    if ( pSubCube0->iLit1 == 0 && pSubCube1->iLit1 == 0 )
    {
        Vec_IntPush( pFxchMan->vCubeFree, SC0_Lit0 );
        Vec_IntPush( pFxchMan->vCubeFree, SC1_Lit0 );
    }
    else if ( pSubCube0->iLit1 > 0 && pSubCube1->iLit1 > 0 )
    {
        int RetValue;

        SC0_Lit1 = Fxch_ManGetLit( pFxchMan, pSubCube0->iCube, pSubCube0->iLit1 );
        SC1_Lit1 = Fxch_ManGetLit( pFxchMan, pSubCube1->iCube, pSubCube1->iLit1 );

        if ( SC0_Lit0 < SC1_Lit0 )
        {
            Vec_IntPush( pFxchMan->vCubeFree, Abc_Var2Lit( SC0_Lit0, 0 ) );
            Vec_IntPush( pFxchMan->vCubeFree, Abc_Var2Lit( SC1_Lit0, 1 ) );
            Vec_IntPush( pFxchMan->vCubeFree, Abc_Var2Lit( SC0_Lit1, 0 ) );
            Vec_IntPush( pFxchMan->vCubeFree, Abc_Var2Lit( SC1_Lit1, 1 ) );
        }
        else
        {
            Vec_IntPush( pFxchMan->vCubeFree, Abc_Var2Lit( SC1_Lit0, 0 ) );
            Vec_IntPush( pFxchMan->vCubeFree, Abc_Var2Lit( SC0_Lit0, 1 ) );
            Vec_IntPush( pFxchMan->vCubeFree, Abc_Var2Lit( SC1_Lit1, 0 ) );
            Vec_IntPush( pFxchMan->vCubeFree, Abc_Var2Lit( SC0_Lit1, 1 ) );
        }

        RetValue = Fxch_DivNormalize( pFxchMan->vCubeFree );
        if ( RetValue == -1 )
            return -1;
    } 
    else
    {
        if ( pSubCube0->iLit1 > 0 )
        {
            SC0_Lit1 = Fxch_ManGetLit( pFxchMan, pSubCube0->iCube, pSubCube0->iLit1 );

            Vec_IntPush( pFxchMan->vCubeFree, SC1_Lit0 );
            if ( SC0_Lit0 == Abc_LitNot( SC1_Lit0 ) )
                Vec_IntPush( pFxchMan->vCubeFree, SC0_Lit1 );
            else if ( SC0_Lit1 == Abc_LitNot( SC1_Lit0 ) )
                Vec_IntPush( pFxchMan->vCubeFree, SC0_Lit0 );
        }
        else 
        {
            SC1_Lit1 = Fxch_ManGetLit( pFxchMan, pSubCube1->iCube, pSubCube1->iLit1 );

            Vec_IntPush( pFxchMan->vCubeFree, SC0_Lit0 );
            if ( SC1_Lit0 == Abc_LitNot( SC0_Lit0 ) )
                Vec_IntPush( pFxchMan->vCubeFree, SC1_Lit1 );
            else if ( SC1_Lit1 == Abc_LitNot( SC0_Lit0 ) )
                Vec_IntPush( pFxchMan->vCubeFree, SC1_Lit0 );
        }
    }

    if ( Vec_IntSize( pFxchMan->vCubeFree ) == 0 )
        return -1;

    if ( Vec_IntSize ( pFxchMan->vCubeFree ) == 2 )
    {
        Vec_IntSort( pFxchMan->vCubeFree, 0 );

        Vec_IntWriteEntry( pFxchMan->vCubeFree, 0, Abc_Var2Lit( Vec_IntEntry( pFxchMan->vCubeFree, 0 ), 0 ) );
        Vec_IntWriteEntry( pFxchMan->vCubeFree, 1, Abc_Var2Lit( Vec_IntEntry( pFxchMan->vCubeFree, 1 ), 1 ) );
    }

    Cube0Size = Vec_IntSize( Fxch_ManGetCube( pFxchMan, pSubCube0->iCube ) );
    Cube1Size = Vec_IntSize( Fxch_ManGetCube( pFxchMan, pSubCube1->iCube ) );
    if ( Vec_IntSize( pFxchMan->vCubeFree ) % 2 == 0 )
    {
        Base = Abc_MinInt( Cube0Size, Cube1Size )
               -( Vec_IntSize( pFxchMan->vCubeFree ) / 2)  - 1; /* 1 or 2 Lits, 1 SOP NodeID */
    }
    else
        return -1;

    return Base;
}